

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsOF.c
# Opt level: O2

void JsObjectProtoIsPrototypeOfCall
               (JsObject *obj,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  int iVar1;
  JsObject *pJVar2;
  
  res->type = JS_BOOLEAN;
  iVar1 = 0;
  if ((0 < argc) && (iVar1 = 0, (*argv)->type == JS_OBJECT)) {
    pJVar2 = ((*argv)->u).object;
    do {
      pJVar2 = pJVar2->Prototype;
      iVar1 = 0;
      if (pJVar2 == (JsObject *)0x0) goto LAB_0010fd31;
    } while (pJVar2 != thisobj);
    iVar1 = 1;
  }
LAB_0010fd31:
  (res->u).boolean = iVar1;
  return;
}

Assistant:

static void JsObjectProtoIsPrototypeOfCall(struct JsObject *obj, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
	struct JsObject* prototype;
	
	res->type = JS_BOOLEAN;
	if(argc <= 0){
		res->u.boolean = FALSE;
		return;
	}
	if(argv[0]->type != JS_OBJECT){
		res->type = JS_BOOLEAN;
		res->u.boolean = FALSE;
		return ;
	}
	prototype = argv[0]->u.object->Prototype;
	//循环查询
	while(prototype != NULL){
		if(prototype == thisobj){
			res->type = JS_BOOLEAN;
			res->u.boolean = TRUE;
			return;
		}
		//下一个对象的原形
		prototype = prototype->Prototype;
	}
	//没有查询到
	res->type = JS_BOOLEAN;
	res->u.boolean = FALSE;
}